

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
slang::CommandLine::parseStr
          (CommandLine *this,string_view argList,ParseOptions options,bool *hasArg,string *current,
          SmallVectorBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *storage)

{
  byte bVar1;
  char *end;
  char **ppcVar2;
  char **ppcVar3;
  char **ptr;
  string_view argList_00;
  string result;
  anon_class_24_3_9a0900af pushArg;
  char **local_88;
  bool *local_80;
  ParseOptions local_78;
  ParseOptions local_74;
  CommandLine *local_70;
  string local_68;
  anon_class_24_3_9a0900af local_48;
  
  local_48.storage = storage;
  ptr = (char **)(argList._M_len + (long)argList._M_str);
  local_74 = (ParseOptions)((uint)options & 0xff00ffff);
  ppcVar2 = (char **)argList._M_str;
  local_80 = hasArg;
  local_78 = options;
  local_70 = this;
  local_48.hasArg = hasArg;
  local_48.current = current;
LAB_001b2bf1:
  do {
    while( true ) {
      ppcVar3 = ppcVar2;
      if (ppcVar3 == ptr) {
        return;
      }
      local_88 = (char **)((long)ppcVar3 + 1);
      bVar1 = *(byte *)ppcVar3;
      end = (char *)(ulong)bVar1;
      if (((char *)0x20 < end) || ((0x100003e00U >> ((ulong)end & 0x3f) & 1) == 0)) break;
      parseStr::anon_class_24_3_9a0900af::operator()(&local_48);
      ppcVar2 = local_88;
    }
    if (((uint)options & 1) == 0) {
      if (bVar1 == 0x5c) goto LAB_001b2ce5;
      if (bVar1 == 0x24) goto LAB_001b2c7e;
LAB_001b2d25:
      *local_80 = true;
      if (bVar1 == 0x27) {
        while (ppcVar2 = local_88, local_88 != ptr) {
          bVar1 = *(byte *)local_88;
          ppcVar2 = (char **)((long)local_88 + 1);
          if (bVar1 == 0x27) break;
          local_88 = (char **)((long)local_88 + 1);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (current,bVar1);
        }
      }
      else {
        if (bVar1 == 0x22) {
LAB_001b2d3f:
          do {
            ppcVar2 = local_88;
            if (local_88 == ptr) goto LAB_001b2bf1;
            ppcVar2 = (char **)((long)local_88 + 1);
            bVar1 = *(byte *)local_88;
            if (bVar1 == 0x5c) {
              bVar1 = 0x5c;
              if ((ppcVar2 != ptr) && ((*(byte *)ppcVar2 == 0x5c || (*(byte *)ppcVar2 == 0x22)))) {
                ppcVar2 = (char **)((long)local_88 + 2);
                bVar1 = *(byte *)((long)local_88 + 1);
                goto LAB_001b2d83;
              }
            }
            else {
              if (bVar1 == 0x22) goto LAB_001b2bf1;
LAB_001b2d83:
              if (((bVar1 == 0x24) && (bVar1 = 0x24, ((uint)options >> 0x10 & 1) != 0)) &&
                 (ppcVar2 != ptr)) {
                local_88 = ppcVar2;
                OS::parseEnvVar_abi_cxx11_(&local_68,(OS *)&local_88,ptr,(char *)0x24);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(current,&local_68);
                std::__cxx11::string::~string((string *)&local_68);
                options = local_78;
                goto LAB_001b2d3f;
              }
            }
            local_88 = ppcVar2;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(current,bVar1);
          } while( true );
        }
LAB_001b2e60:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (current,bVar1);
        ppcVar2 = local_88;
      }
      goto LAB_001b2bf1;
    }
    if (bVar1 != 0x5c) {
      if (bVar1 == 0x24) {
LAB_001b2c7e:
        if ((local_88 != ptr & options.expandEnvVars) == 1) {
          OS::parseEnvVar_abi_cxx11_(&local_68,(OS *)&local_88,ptr,end);
          argList_00._M_str = local_68._M_dataplus._M_p;
          argList_00._M_len = local_68._M_string_length;
          parseStr(local_70,argList_00,local_74,local_80,current,storage);
          std::__cxx11::string::~string((string *)&local_68);
          ppcVar2 = local_88;
          options = local_78;
          goto LAB_001b2bf1;
        }
      }
      else {
        if (bVar1 != 0x2f) {
          if (bVar1 != 0x23) goto LAB_001b2d25;
          parseStr::anon_class_24_3_9a0900af::operator()(&local_48);
          for (; ((ppcVar2 = local_88, local_88 != ptr && (*(byte *)local_88 != 10)) &&
                 (*(byte *)local_88 != 0xd)); local_88 = (char **)((long)local_88 + 1)) {
          }
          goto LAB_001b2bf1;
        }
        if (local_88 != ptr && *local_80 == false) {
          if (*(byte *)local_88 == 0x2a) {
            parseStr::anon_class_24_3_9a0900af::operator()(&local_48);
            ppcVar2 = (char **)((long)local_88 + 1);
            do {
              local_88 = ppcVar2;
              ppcVar2 = local_88;
              if (local_88 == ptr) goto LAB_001b2bf1;
              ppcVar2 = (char **)((long)local_88 + 1);
            } while ((ppcVar2 == ptr || *(byte *)local_88 != 0x2a) || (*(byte *)ppcVar2 != 0x2f));
            ppcVar2 = (char **)((long)local_88 + 2);
            goto LAB_001b2bf1;
          }
          if (*(byte *)local_88 == 0x2f) {
            parseStr::anon_class_24_3_9a0900af::operator()(&local_48);
            do {
              local_88 = (char **)((long)local_88 + 1);
              ppcVar2 = local_88;
              if ((local_88 == ptr) || (*(byte *)local_88 == 10)) break;
            } while (*(byte *)local_88 != 0xd);
            goto LAB_001b2bf1;
          }
        }
      }
      *local_80 = true;
      goto LAB_001b2e60;
    }
LAB_001b2ce5:
    ppcVar2 = local_88;
    if (((local_88 != ptr) && (*(byte *)local_88 != 10)) && (*(byte *)local_88 != 0xd)) {
      local_88 = (char **)((long)ppcVar3 + 2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (current,*(byte *)((long)ppcVar3 + 1));
      *local_80 = true;
      ppcVar2 = local_88;
    }
  } while( true );
}

Assistant:

void CommandLine::parseStr(std::string_view argList, ParseOptions options, bool& hasArg,
                           std::string& current, SmallVectorBase<std::string>& storage) {
    auto pushArg = [&]() {
        if (hasArg) {
            storage.emplace_back(std::move(current));
            current.clear();
            hasArg = false;
        }
    };

    auto ptr = argList.data();
    auto end = ptr + argList.size();
    while (ptr != end) {
        // Whitespace breaks up arguments.
        char c = *ptr++;
        if (isWhitespace(c)) {
            pushArg();
            continue;
        }

        // Check for and consume comments.
        if (options.supportComments && (c == '#' || c == '/')) {
            // Slash character only applies if we aren't building an argument already.
            // The hash always applies, even if adjacent to an argument.
            if (c == '#') {
                pushArg();
                while (ptr != end && !isNewline(*ptr))
                    ptr++;
                continue;
            }

            if (!hasArg && ptr != end) {
                if (*ptr == '/') {
                    pushArg();
                    ptr++;
                    while (ptr != end && !isNewline(*ptr))
                        ptr++;
                    continue;
                }
                else if (*ptr == '*') {
                    pushArg();
                    ptr++;
                    while (ptr != end) {
                        c = *ptr++;
                        if (c == '*' && ptr != end && *ptr == '/') {
                            ptr++;
                            break;
                        }
                    }
                    continue;
                }
            }
        }

        // Look for environment variables to expand.
        if (c == '$' && options.expandEnvVars && ptr != end) {
            std::string result = OS::parseEnvVar(ptr, end);

            ParseOptions newOptions = options;
            newOptions.expandEnvVars = false;
            parseStr(result, newOptions, hasArg, current, storage);
            continue;
        }

        // Escape character preserves the value of the next character.
        if (c == '\\') {
            if (ptr != end && *ptr != '\n' && *ptr != '\r') {
                current += *ptr++;
                hasArg = true;
            }
            continue;
        }

        // Any non-whitespace character here means we are building an argument.
        hasArg = true;

        // Single quotes consume all characters until the next single quote.
        if (c == '\'') {
            while (ptr != end) {
                c = *ptr++;
                if (c == '\'')
                    break;
                current += c;
            }
            continue;
        }

        // Double quotes consume all characters except escaped characters.
        if (c == '"') {
            while (ptr != end) {
                c = *ptr++;
                if (c == '"')
                    break;

                // Only backslashes and quotes can be escaped.
                if (c == '\\' && ptr != end && (*ptr == '\\' || *ptr == '"'))
                    c = *ptr++;

                if (c == '$' && options.expandEnvVars && ptr != end)
                    current.append(OS::parseEnvVar(ptr, end));
                else
                    current += c;
            }
            continue;
        }

        // Otherwise we just have a normal character.
        current += c;
    }
}